

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DictVectorizer::MergeFrom(DictVectorizer *this,DictVectorizer *from)

{
  void *pvVar1;
  LogMessage *other;
  Int64Vector *pIVar2;
  StringVector *pSVar3;
  Int64Vector *from_00;
  StringVector *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/DictVectorizer.pb.cc"
               ,0x120);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_Map(this);
      this->_oneof_case_[0] = 1;
      pSVar3 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(pSVar3);
      (this->Map_).stringtoindex_ = pSVar3;
    }
    pSVar3 = (this->Map_).stringtoindex_;
    if (from->_oneof_case_[0] == 1) {
      from_01 = (from->Map_).stringtoindex_;
    }
    else {
      from_01 = StringVector::default_instance();
    }
    StringVector::MergeFrom(pSVar3,from_01);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_Map(this);
      this->_oneof_case_[0] = 2;
      pIVar2 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar2);
      (this->Map_).int64toindex_ = pIVar2;
    }
    pIVar2 = (this->Map_).int64toindex_;
    if (from->_oneof_case_[0] == 2) {
      from_00 = (from->Map_).int64toindex_;
    }
    else {
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar2,from_00);
  }
  return;
}

Assistant:

void DictVectorizer::MergeFrom(const DictVectorizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DictVectorizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.Map_case()) {
    case kStringToIndex: {
      mutable_stringtoindex()->::CoreML::Specification::StringVector::MergeFrom(from.stringtoindex());
      break;
    }
    case kInt64ToIndex: {
      mutable_int64toindex()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64toindex());
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
}